

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBar(char *str_id,ImGuiTabBarFlags flags)

{
  ImGuiID IVar1;
  ImGuiTabBar *pIVar2;
  ImRect tab_bar_bb;
  ImGuiTabBar *tab_bar;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_00000030;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImPool<ImGuiTabBar> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ImGuiWindow *str;
  ImGuiContext *pIVar3;
  bool local_1;
  
  str = GImGui->CurrentWindow;
  if ((str->SkipItems & 1U) == 0) {
    pIVar3 = GImGui;
    IVar1 = ImGuiWindow::GetID((ImGuiWindow *)GImGui,(char *)str,
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                              );
    pIVar2 = ImPool<ImGuiTabBar>::GetOrAddByKey
                       (in_stack_ffffffffffffffc8,(ImGuiID)in_stack_ffffffffffffffc4);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(pIVar3->Style).FramePadding.y),
                    ZEXT416((uint)((str->DC).CursorPos.y + pIVar3->FontSize)));
    ImRect::ImRect((ImRect *)CONCAT44(IVar1,in_stack_ffffffffffffffd0),
                   (float)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0),in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
    pIVar2->ID = IVar1;
    local_1 = BeginTabBarEx((ImGuiTabBar *)str_id,(ImRect *)CONCAT44(flags,in_stack_00000030),
                            g._4_4_);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBar(const char* str_id, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiID id = window->GetID(str_id);
    ImGuiTabBar* tab_bar = g.TabBars.GetOrAddByKey(id);
    ImRect tab_bar_bb = ImRect(window->DC.CursorPos.x, window->DC.CursorPos.y, window->WorkRect.Max.x, window->DC.CursorPos.y + g.FontSize + g.Style.FramePadding.y * 2);
    tab_bar->ID = id;
    return BeginTabBarEx(tab_bar, tab_bar_bb, flags | ImGuiTabBarFlags_IsFocused);
}